

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O1

ogt_vox_scene *
ogt_vox_merge_scenes
          (ogt_vox_scene **scenes,uint32_t scene_count,ogt_vox_rgba *required_colors,
          uint32_t required_color_count)

{
  ogt_vox_instance *poVar1;
  ogt_vox_transform *poVar2;
  ogt_vox_rgba *poVar3;
  ogt_vox_rgba oVar4;
  undefined4 uVar5;
  ogt_vox_model **ppoVar6;
  uint8_t *puVar7;
  ogt_vox_model *poVar8;
  ogt_vox_group *poVar9;
  char *pcVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  ulong uVar20;
  ulong uVar21;
  ogt_vox_layer *poVar22;
  ogt_vox_model *poVar23;
  ogt_vox_model *poVar24;
  size_t sVar25;
  ogt_vox_scene *poVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint32_t uVar30;
  int iVar31;
  ulong uVar32;
  uint32_t instance_index;
  uint uVar33;
  ogt_vox_instance *poVar34;
  ogt_vox_model **ppoVar35;
  undefined8 *puVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  uint32_t *puVar40;
  ogt_vox_instance *poVar41;
  int32_t best_score;
  int iVar42;
  uint32_t color_index_1;
  ulong in_R11;
  size_t __n;
  ogt_vox_scene *__dest;
  long lVar43;
  int iVar44;
  bool bVar45;
  byte bVar46;
  float fVar47;
  uint32_t num_instances;
  uint32_t base_model_index;
  _vox_array<unsigned_int> per_scene_base_instance_index;
  _vox_array<unsigned_int> per_scene_base_model_index;
  bool scene_used_mask [256];
  ogt_vox_rgba master_palette [256];
  uint32_t scene_color_index_to_master_map [256];
  ogt_vox_matl materials [256];
  uint local_4a68;
  uint local_4a64;
  ogt_vox_scene *local_4a60;
  ulong local_4a58;
  ogt_vox_instance *local_4a50;
  long local_4a48;
  uint local_4a3c;
  ogt_vox_model **local_4a38;
  ogt_vox_scene *local_4a30;
  uint local_4a24;
  ulong local_4a20;
  ulong local_4a18;
  ulong local_4a10;
  ogt_vox_instance *local_4a08;
  ogt_vox_model **local_4a00;
  ogt_vox_group *local_49f8;
  uint32_t local_49f0;
  uint32_t local_49ec;
  undefined8 local_49e8;
  float local_49e0;
  _vox_array<unsigned_int> local_49d8;
  _vox_array<unsigned_int> local_49b8;
  ogt_vox_layer *local_4998;
  ulong local_4990;
  ogt_vox_scene **local_4988;
  ulong local_4980;
  undefined1 local_4978 [64];
  undefined1 local_4938 [16];
  float local_4928;
  float fStack_4924;
  float fStack_4920;
  float fStack_491c;
  float local_4918;
  float fStack_4914;
  float fStack_4910;
  float fStack_490c;
  float local_4908;
  float fStack_4904;
  float fStack_4900;
  float fStack_48fc;
  undefined4 uStack_483c;
  ogt_vox_rgba local_4838;
  byte local_4834;
  uint8_t local_4833 [1019];
  undefined4 local_4438;
  uint local_4434 [255];
  undefined8 local_4038 [2049];
  
  bVar46 = 0;
  if (0xff < required_color_count) {
    __assert_fail("(required_color_count <= 255) && (\"too many colors specified\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                  ,0xb6c,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  uVar32 = (ulong)scene_count;
  memset(&local_4838,0,0x400);
  memset(local_4038,0,0x4000);
  local_4a68 = 1;
  uVar20 = 1;
  if (required_color_count != 0) {
    memcpy(&local_4834,required_colors,(ulong)(required_color_count * 4));
    uVar20 = (ulong)(required_color_count + 1);
  }
  uVar38 = 0;
  local_49ec = 0;
  if (scene_count != 0) {
    local_4a68 = 1;
    uVar21 = 0;
    uVar38 = 0;
    local_49ec = 0;
    do {
      poVar26 = scenes[uVar21];
      if (poVar26 != (ogt_vox_scene *)0x0) {
        local_49ec = local_49ec + poVar26->num_instances;
        uVar38 = uVar38 + poVar26->num_models;
        local_4a68 = local_4a68 + poVar26->num_groups;
      }
      uVar21 = uVar21 + 1;
    } while (uVar32 != uVar21);
  }
  local_4990 = uVar32;
  local_4988 = scenes;
  if (local_49ec == 0) {
    local_4a50 = (ogt_vox_instance *)0x0;
  }
  else {
    local_4a50 = (ogt_vox_instance *)(*g_alloc_func)((ulong)local_49ec * 0x78);
  }
  lVar28 = 0;
  local_49f0 = uVar38;
  if (uVar38 == 0) {
    local_4a38 = (ogt_vox_model **)0x0;
  }
  else {
    local_4a38 = (ogt_vox_model **)(*g_alloc_func)((ulong)uVar38 << 3);
  }
  poVar22 = (ogt_vox_layer *)(*g_alloc_func)(0x10);
  local_49f8 = (ogt_vox_group *)(*g_alloc_func)((ulong)local_4a68 * 0x68);
  local_4a64 = 0;
  poVar22->hidden = false;
  (poVar22->color).r = 0xff;
  (poVar22->color).g = 0xff;
  (poVar22->color).b = 0xff;
  (poVar22->color).a = 0xff;
  poVar22->name = "merged";
  local_49f8->name = (char *)0x0;
  (local_49f8->transform).m00 = 1.0;
  (local_49f8->transform).m01 = 0.0;
  (local_49f8->transform).m02 = 0.0;
  (local_49f8->transform).m03 = 0.0;
  (local_49f8->transform).m10 = 0.0;
  (local_49f8->transform).m11 = 1.0;
  (local_49f8->transform).m12 = 0.0;
  (local_49f8->transform).m13 = 0.0;
  (local_49f8->transform).m20 = 0.0;
  (local_49f8->transform).m21 = 0.0;
  (local_49f8->transform).m22 = 1.0;
  (local_49f8->transform).m23 = 0.0;
  (local_49f8->transform).m30 = 0.0;
  (local_49f8->transform).m31 = 0.0;
  (local_49f8->transform).m32 = 0.0;
  *(undefined8 *)&(local_49f8->transform).m33 = 0xffffffff3f800000;
  local_49f8->layer_index = 0;
  local_49f8->hidden = false;
  (local_49f8->transform_anim).keyframes = (ogt_vox_keyframe_transform *)0x0;
  (local_49f8->transform_anim).num_keyframes = 0;
  (local_49f8->transform_anim).loop = false;
  local_49b8.count = 0;
  local_49b8.data = (uint *)0x0;
  local_49b8.capacity = 0;
  local_49d8.count = 0;
  local_49d8.data = (uint *)0x0;
  local_49d8.capacity = 0;
  poVar34 = local_4a50;
  local_4998 = poVar22;
  if (scene_count == 0) {
    uVar38 = 1;
  }
  else {
    local_4a58 = 1;
    uVar32 = 0;
    local_4a3c = 0;
    lVar28 = 0;
    local_4a20 = 0;
    do {
      poVar26 = local_4988[uVar32];
      local_4a10 = uVar32;
      if (poVar26 != (ogt_vox_scene *)0x0) {
        local_4a48 = lVar28;
        memset(local_4938,0,0x100);
        ppoVar35 = local_4a38;
        uVar33 = local_4a3c;
        uVar38 = poVar26->num_models;
        if ((ulong)uVar38 != 0) {
          ppoVar6 = poVar26->models;
          uVar32 = 0;
          do {
            poVar24 = ppoVar6[uVar32];
            uVar39 = poVar24->size_y * poVar24->size_x * poVar24->size_z;
            if (uVar39 != 0) {
              puVar7 = poVar24->voxel_data;
              uVar21 = 0;
              do {
                local_4938[puVar7[uVar21]] = 1;
                uVar21 = uVar21 + 1;
              } while (uVar39 != uVar21);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar38);
        }
        local_4438 = 0;
        memset(local_4434,0xff,0x3fc);
        lVar28 = 1;
        do {
          if (local_4938[lVar28] == '\x01') {
            uVar39 = (uint)uVar20;
            uVar20 = uVar20 & 0xffffffff;
            oVar4 = (poVar26->palette).color[lVar28];
            uVar38 = 0xffffffff;
            if (1 < uVar39) {
              uVar32 = 1;
              do {
                bVar45 = true;
                if ((((&local_4838)[uVar32].r == oVar4.r) && ((&local_4838)[uVar32].g == oVar4.g))
                   && ((&local_4838)[uVar32].b == oVar4.b)) {
                  bVar45 = false;
                  in_R11 = uVar32 & 0xffffffff;
                }
                if (!bVar45) {
                  uVar38 = (uint)in_R11;
                  break;
                }
                uVar32 = uVar32 + 1;
              } while (uVar20 != uVar32);
            }
            if (uVar38 == 0xffffffff) {
              if (uVar39 < 0x100) {
                puVar40 = &(poVar26->materials).matl[lVar28].content_flags;
                (&local_4838)[uVar20] = oVar4;
                uVar11 = *(undefined8 *)(puVar40 + 2);
                uVar12 = *(undefined8 *)(puVar40 + 4);
                uVar13 = *(undefined8 *)(puVar40 + 6);
                uVar14 = *(undefined8 *)(puVar40 + 8);
                uVar15 = *(undefined8 *)(puVar40 + 10);
                uVar16 = *(undefined8 *)(puVar40 + 0xc);
                uVar17 = *(undefined8 *)(puVar40 + 0xe);
                local_4038[uVar20 * 8] = *(undefined8 *)puVar40;
                local_4038[uVar20 * 8 + 1] = uVar11;
                local_4038[uVar20 * 8 + 2] = uVar12;
                local_4038[uVar20 * 8 + 3] = uVar13;
                local_4038[uVar20 * 8 + 4] = uVar14;
                local_4038[uVar20 * 8 + 5] = uVar15;
                local_4038[uVar20 * 8 + 6] = uVar16;
                local_4038[uVar20 * 8 + 7] = uVar17;
                uVar20 = (ulong)(uVar39 + 1);
                uVar38 = uVar39;
              }
              else {
                uVar32 = 1;
                iVar42 = 0x7fffffff;
                in_R11 = 1;
                do {
                  iVar27 = ((uint)oVar4 & 0xff) - (uint)(&local_4838)[in_R11].r;
                  iVar31 = ((uint)oVar4 >> 8 & 0xff) - (uint)(&local_4838)[in_R11].g;
                  iVar44 = ((uint)oVar4 >> 0x10 & 0xff) - (uint)(&local_4838)[in_R11].b;
                  iVar27 = iVar44 * iVar44 + iVar31 * iVar31 + iVar27 * iVar27;
                  if (iVar27 < iVar42) {
                    uVar32 = in_R11 & 0xffffffff;
                  }
                  uVar38 = (uint)uVar32;
                  if (iVar27 < iVar42) {
                    iVar42 = iVar27;
                  }
                  in_R11 = in_R11 + 1;
                  ppoVar35 = local_4a38;
                  uVar33 = local_4a3c;
                } while (uVar20 != in_R11);
              }
            }
            local_4434[lVar28 + -1] = uVar38;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x100);
        local_4a24 = uVar33;
        _vox_array<unsigned_int>::push_back(&local_49b8,&local_4a24);
        _vox_array<unsigned_int>::push_back(&local_49d8,&local_4a64);
        local_4980 = uVar20;
        if (poVar26->num_models == 0) {
          bVar45 = true;
        }
        else {
          uVar32 = 0;
          do {
            poVar8 = poVar26->models[uVar32];
            uVar20 = (ulong)(poVar8->size_y * poVar8->size_x * poVar8->size_z);
            poVar23 = (ogt_vox_model *)(*g_alloc_func)(uVar20 + 0x18);
            poVar24 = poVar23 + 1;
            if (uVar20 != 0) {
              uVar21 = 0;
              do {
                if (0xff < local_4434[(ulong)poVar8->voxel_data[uVar21] - 1]) {
                  __assert_fail("(new_color_index < 256) && (\"color index out of bounds\")",
                                "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                                ,0xbc4,
                                "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                               );
                }
                *(char *)((long)&poVar24->size_x + uVar21) =
                     (char)local_4434[(ulong)poVar8->voxel_data[uVar21] - 1];
                uVar21 = uVar21 + 1;
              } while (uVar20 != uVar21);
            }
            poVar23->voxel_data = poVar8->voxel_data;
            uVar30 = poVar8->size_y;
            uVar18 = poVar8->size_z;
            uVar19 = poVar8->voxel_hash;
            poVar23->size_x = poVar8->size_x;
            poVar23->size_y = uVar30;
            poVar23->size_z = uVar18;
            poVar23->voxel_hash = uVar19;
            poVar23->voxel_data = (uint8_t *)poVar24;
            if (uVar20 == 0) {
              uVar30 = 0;
            }
            else {
              uVar21 = 0;
              uVar30 = 0;
              do {
                uVar30 = uVar30 * 0x10017 + (uint)*(byte *)((long)&poVar24->size_x + uVar21);
                uVar21 = uVar21 + 1;
              } while (uVar20 != uVar21);
            }
            poVar23->voxel_hash = uVar30;
            uVar20 = (ulong)uVar33;
            uVar33 = uVar33 + 1;
            ppoVar35[uVar20] = poVar23;
            uVar32 = uVar32 + 1;
          } while (uVar32 < poVar26->num_models);
          bVar45 = poVar26->num_models == 0;
          local_4a3c = uVar33;
        }
        local_4a18 = (ulong)poVar26->num_instances;
        iVar42 = 0;
        local_4a30 = (ogt_vox_scene *)0x0;
        local_4a60 = poVar26;
        if (!(bool)(local_4a18 == 0 | bVar45)) {
          local_4a00 = poVar26->models;
          local_4a08 = poVar26->instances;
          local_4a30 = (ogt_vox_scene *)0xf8000001;
          iVar42 = 0x7ffffff;
          uVar32 = 0;
          do {
            poVar2 = &local_4a08[uVar32].transform;
            local_4938._0_4_ = poVar2->m00;
            local_4938._4_4_ = poVar2->m01;
            local_4938._8_8_ = *(undefined8 *)&poVar2->m02;
            poVar34 = local_4a08 + uVar32;
            local_4928 = (poVar34->transform).m10;
            fStack_4924 = (poVar34->transform).m11;
            _fStack_4920 = *(undefined8 *)(&(poVar34->transform).m10 + 2);
            poVar34 = local_4a08 + uVar32;
            local_4918 = (poVar34->transform).m20;
            fStack_4914 = (poVar34->transform).m21;
            _fStack_4910 = *(undefined8 *)(&(poVar34->transform).m20 + 2);
            poVar34 = local_4a08 + uVar32;
            local_4908 = (poVar34->transform).m30;
            fStack_4904 = (poVar34->transform).m31;
            _fStack_4900 = *(undefined8 *)(&(poVar34->transform).m30 + 2);
            uVar38 = local_4a08[uVar32].group_index;
            if (uVar38 != 0xffffffff) {
              poVar9 = local_4a60->groups;
              do {
                ogt_vox_transform_multiply
                          ((ogt_vox_transform *)local_4978,(ogt_vox_transform *)local_4938,
                           &poVar9[uVar38].transform);
                local_4908 = (float)local_4978._48_4_;
                fStack_4904 = (float)local_4978._52_4_;
                fStack_4900 = (float)local_4978._56_4_;
                fStack_48fc = (float)local_4978._60_4_;
                local_4918 = (float)local_4978._32_4_;
                fStack_4914 = (float)local_4978._36_4_;
                fStack_4910 = (float)local_4978._40_4_;
                fStack_490c = (float)local_4978._44_4_;
                local_4928 = (float)local_4978._16_4_;
                fStack_4924 = (float)local_4978._20_4_;
                fStack_4920 = (float)local_4978._24_4_;
                fStack_491c = (float)local_4978._28_4_;
                local_4938._0_8_ = local_4978._0_8_;
                local_4938._8_8_ = local_4978._8_8_;
                uVar38 = poVar9[uVar38].parent_group_index;
              } while (uVar38 != 0xffffffff);
            }
            poVar24 = local_4a00[local_4a08[uVar32].model_index];
            if (((float)local_4938._0_4_ == 0.0) && (!NAN((float)local_4938._0_4_))) {
              if ((local_4928 != 0.0) || (NAN(local_4928))) {
                poVar24 = (ogt_vox_model *)&poVar24->size_y;
              }
              else if ((local_4918 != 0.0) || (NAN(local_4918))) {
                poVar24 = (ogt_vox_model *)&poVar24->size_z;
              }
            }
            iVar27 = (int)poVar24->size_x / 2;
            iVar31 = (int)local_4908 - iVar27;
            uVar38 = iVar27 + (int)local_4908;
            if (iVar31 < iVar42) {
              iVar42 = iVar31;
            }
            iVar27 = (int)local_4a30;
            local_4a30 = (ogt_vox_scene *)((ulong)local_4a30 & 0xffffffff);
            if (iVar27 < (int)uVar38) {
              local_4a30 = (ogt_vox_scene *)(ulong)uVar38;
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != local_4a18);
        }
        if (local_4a60->groups->parent_group_index != 0xffffffff) {
          __assert_fail("(scene->groups[0].parent_group_index == k_invalid_group_index) && (\"first group of scene must not be parented to any other group\")"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                        ,0xbd7,
                        "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                       );
        }
        uVar38 = (int)local_4a20 - iVar42;
        local_4a20 = (ulong)uVar38;
        local_4a18 = CONCAT44(local_4a18._4_4_,(float)(int)uVar38);
        uVar32 = (ulong)local_4a60->num_groups;
        uVar38 = (uint)local_4a58;
        if (1 < local_4a60->num_groups) {
          local_4a00 = (ogt_vox_model **)(ulong)(uVar38 - 1);
          local_4a08 = (ogt_vox_instance *)(local_4a58 & 0xffffffff);
          uVar20 = 1;
          lVar28 = 0xcc;
          do {
            poVar9 = local_4a60->groups;
            uVar38 = *(uint *)((long)poVar9 + lVar28 + -0x1c);
            if (uVar38 == 0xffffffff) {
              __assert_fail("(src_group->parent_group_index != k_invalid_group_index) && (\"all groups after the first in the scene must be parented to a valid group\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                            ,0xbdb,
                            "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                           );
            }
            pcVar10 = *(char **)((long)poVar9 + lVar28 + -100);
            puVar36 = (undefined8 *)((long)poVar9 + lVar28 + -0x3c);
            _local_4918 = *puVar36;
            _fStack_4910 = puVar36[1];
            puVar36 = (undefined8 *)((long)poVar9 + lVar28 + -0x4c);
            _local_4928 = *puVar36;
            _fStack_4920 = puVar36[1];
            puVar36 = (undefined8 *)((long)poVar9 + lVar28 + -0x5c);
            local_4938._0_8_ = *puVar36;
            local_4938._8_8_ = puVar36[1];
            fVar47 = *(float *)((long)poVar9 + lVar28 + -0x2c);
            local_49e0 = *(float *)((long)poVar9 + lVar28 + -0x20);
            local_49e8 = *(undefined8 *)((long)poVar9 + lVar28 + -0x28);
            puVar36 = (undefined8 *)((long)poVar9 + lVar28 + -0x14);
            local_4978._0_8_ = *puVar36;
            local_4978._8_8_ = puVar36[1];
            if ((uint)uVar32 <= uVar38) {
              __assert_fail("(dst_group.parent_group_index < scene->num_groups) && (\"group index is out of bounds\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                            ,0xbdd,
                            "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                           );
            }
            uVar33 = *(uint *)((long)poVar9 + lVar28 + -4);
            uVar5 = *(undefined4 *)((long)&poVar9->name + lVar28);
            uVar30 = (int)local_4a00 + uVar38;
            if (uVar38 == 0) {
              uVar30 = 0;
            }
            if (pcVar10 != (char *)0x0) {
              sVar25 = strlen(pcVar10);
              local_4a48 = local_4a48 + sVar25 + 1;
            }
            if (uVar30 == 0) {
              fVar47 = fVar47 + (float)local_4a18;
            }
            uVar38 = ((int)local_4a08 + (int)uVar20) - 1;
            local_4a48 = local_4a48 + (ulong)uVar33 * 0x44;
            local_49f8[uVar38].name = pcVar10;
            poVar2 = &local_49f8[uVar38].transform;
            poVar2->m00 = (float)local_4938._0_4_;
            poVar2->m01 = (float)local_4938._4_4_;
            poVar2->m02 = (float)local_4938._8_4_;
            poVar2->m03 = (float)local_4938._12_4_;
            poVar9 = local_49f8 + uVar38;
            (poVar9->transform).m10 = local_4928;
            (poVar9->transform).m11 = fStack_4924;
            *(undefined8 *)(&(poVar9->transform).m10 + 2) = _fStack_4920;
            poVar9 = local_49f8 + uVar38;
            (poVar9->transform).m20 = local_4918;
            (poVar9->transform).m21 = fStack_4914;
            *(undefined8 *)(&(poVar9->transform).m20 + 2) = _fStack_4910;
            local_49f8[uVar38].transform.m30 = fVar47;
            local_49f8[uVar38].transform.m31 = (float)(undefined4)local_49e8;
            local_49f8[uVar38].transform.m32 = (float)local_49e8._4_4_;
            local_49f8[uVar38].transform.m33 = local_49e0;
            local_49f8[uVar38].parent_group_index = uVar30;
            local_49f8[uVar38].layer_index = 0;
            *(undefined8 *)&local_49f8[uVar38].hidden = local_4978._0_8_;
            ((ogt_vox_anim_transform *)(&local_49f8[uVar38].hidden + 8))->keyframes =
                 (ogt_vox_keyframe_transform *)local_4978._8_8_;
            local_49f8[uVar38].transform_anim.num_keyframes = uVar33;
            *(undefined4 *)&local_49f8[uVar38].transform_anim.loop = uVar5;
            uVar20 = uVar20 + 1;
            uVar32 = (ulong)local_4a60->num_groups;
            lVar28 = lVar28 + 0x68;
          } while (uVar20 < uVar32);
          uVar38 = ((int)local_4a58 + (int)uVar20) - 1;
        }
        poVar34 = local_4a50;
        lVar28 = local_4a48;
        if (local_4a60->num_instances != 0) {
          local_4a58 = (ulong)((int)local_4a58 - 1);
          lVar43 = 0;
          uVar32 = 0;
          do {
            if (local_4a60->num_groups <=
                *(uint *)((long)&local_4a60->instances->group_index + lVar43)) {
              __assert_fail("(src_instance->group_index < scene->num_groups) && (\"group index is out of bounds\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                            ,0xbed,
                            "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                           );
            }
            uVar20 = (ulong)local_4a64;
            local_4a64 = local_4a64 + 1;
            poVar1 = poVar34 + uVar20;
            puVar36 = (undefined8 *)((long)&local_4a60->instances->name + lVar43);
            poVar41 = poVar1;
            for (lVar29 = 0xf; lVar29 != 0; lVar29 = lVar29 + -1) {
              poVar41->name = (char *)*puVar36;
              puVar36 = puVar36 + (ulong)bVar46 * -2 + 1;
              poVar41 = (ogt_vox_instance *)((long)poVar41 + (ulong)bVar46 * -0x10 + 8);
            }
            poVar34[uVar20].layer_index = 0;
            uVar30 = (int)local_4a58 + poVar34[uVar20].group_index;
            if (poVar34[uVar20].group_index == 0) {
              uVar30 = 0;
            }
            poVar34[uVar20].group_index = uVar30;
            poVar34[uVar20].model_index = poVar34[uVar20].model_index + local_4a24;
            if (poVar34[uVar20].name != (char *)0x0) {
              sVar25 = strlen(poVar34[uVar20].name);
              lVar28 = lVar28 + sVar25 + 1;
            }
            uVar33 = (poVar1->transform_anim).num_keyframes;
            uVar39 = (poVar1->model_anim).num_keyframes;
            if (uVar30 == 0) {
              (poVar1->transform).m30 = (poVar1->transform).m30 + (float)local_4a18;
            }
            lVar28 = (ulong)uVar33 * 0x44 + lVar28 + (ulong)uVar39 * 8;
            uVar32 = uVar32 + 1;
            lVar43 = lVar43 + 0x78;
          } while (uVar32 < local_4a60->num_instances);
        }
        local_4a20 = (ulong)((int)local_4a20 + (int)local_4a30 + 4);
        local_4a58 = (ulong)uVar38;
        uVar20 = local_4980;
      }
      uVar32 = local_4a10 + 1;
      uVar38 = (uint)local_4a58;
    } while (uVar32 != local_4990);
  }
  if ((uint)uVar20 < 0x100) {
    uVar20 = uVar20 & 0xffffffff;
    do {
      uVar20 = uVar20 + 1;
      (&uStack_483c)[uVar20] = 0xffff00ff;
    } while ((int)uVar20 != 0x100);
  }
  __n = lVar28 + 0x4440;
  if (__n == 0) {
    poVar26 = (ogt_vox_scene *)0x0;
  }
  else {
    poVar26 = (ogt_vox_scene *)(*g_alloc_func)(__n);
  }
  local_4a48 = lVar28;
  if (poVar26 != (ogt_vox_scene *)0x0) {
    memset(poVar26,0,__n);
  }
  __dest = poVar26 + 1;
  local_4a60 = __dest;
  local_4a30 = poVar26;
  if (local_4a64 != 0) {
    uVar32 = 0;
    do {
      poVar1 = poVar34 + uVar32;
      pcVar10 = poVar34[uVar32].name;
      poVar26 = __dest;
      if (pcVar10 != (char *)0x0) {
        sVar25 = strlen(pcVar10);
        memcpy(__dest,pcVar10,sVar25 + 1);
        poVar1->name = (char *)__dest;
        poVar26 = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + 1 + sVar25);
      }
      uVar30 = (poVar1->model_anim).num_keyframes;
      __dest = poVar26;
      if (uVar30 != 0) {
        uVar20 = (ulong)(uVar30 << 3);
        memcpy(poVar26,(poVar1->model_anim).keyframes,uVar20);
        (poVar1->model_anim).keyframes = (ogt_vox_keyframe_model *)poVar26;
        __dest = (ogt_vox_scene *)((long)((poVar26->palette).color + -0xc) + uVar20);
        uVar20 = local_49d8.count & 0xffffffff;
        do {
          uVar20 = uVar20 - 1;
          if ((int)(uint)uVar20 < 0) goto LAB_00108b78;
          uVar21 = (ulong)((uint)uVar20 & 0x7fffffff);
          if (local_49d8.count <= uVar21) goto LAB_00108d5e;
        } while (uVar32 < local_49d8.data[uVar21]);
        uVar20 = (ulong)(poVar1->model_anim).num_keyframes;
        if (uVar20 != 0) {
          if (local_49b8.count <= uVar21) {
LAB_00108d5e:
            __assert_fail("(index < count) && (\"index out of bounds\")",
                          "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                          ,0x324,
                          "T &_vox_array<unsigned int>::operator[](size_t) [T = unsigned int]");
          }
          uVar37 = 0;
          do {
            poVar3 = (poVar26->palette).color + uVar37 * 2 + -0xb;
            *poVar3 = (ogt_vox_rgba)((int)*poVar3 + local_49b8.data[uVar21]);
            uVar37 = uVar37 + 1;
          } while (uVar20 != uVar37);
        }
      }
LAB_00108b78:
      poVar34 = local_4a50;
      uVar30 = (poVar1->transform_anim).num_keyframes;
      if (uVar30 != 0) {
        uVar20 = (ulong)(uVar30 * 0x44);
        memcpy(__dest,(poVar1->transform_anim).keyframes,uVar20);
        (poVar1->transform_anim).keyframes = (ogt_vox_keyframe_transform *)__dest;
        __dest = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + uVar20);
      }
      uVar32 = uVar32 + 1;
    } while (uVar32 < local_4a64);
  }
  poVar9 = local_49f8;
  ppoVar35 = local_4a38;
  if (uVar38 != 0) {
    lVar28 = 0;
    do {
      pcVar10 = *(char **)((long)&poVar9->name + lVar28);
      if (pcVar10 != (char *)0x0) {
        sVar25 = strlen(pcVar10);
        memcpy(__dest,pcVar10,sVar25 + 1);
        *(ogt_vox_scene **)((long)&poVar9->name + lVar28) = __dest;
        __dest = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + 1 + sVar25);
      }
      ppoVar35 = local_4a38;
      iVar42 = *(int *)((long)&(poVar9->transform_anim).num_keyframes + lVar28);
      if (iVar42 != 0) {
        uVar32 = (ulong)(uint)(iVar42 * 0x44);
        memcpy(__dest,*(void **)((long)&(poVar9->transform_anim).keyframes + lVar28),uVar32);
        *(ogt_vox_scene **)((long)&(poVar9->transform_anim).keyframes + lVar28) = __dest;
        __dest = (ogt_vox_scene *)((long)((__dest->palette).color + -0xc) + uVar32);
      }
      lVar28 = lVar28 + 0x68;
    } while ((ulong)uVar38 * 0x68 - lVar28 != 0);
  }
  poVar26 = local_4a30;
  poVar34 = local_4a50;
  if ((ogt_vox_scene *)((long)((local_4a60->palette).color + -0xc) + local_4a48) < __dest) {
    __assert_fail("(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size)) && (\"misc_data allocation was overrun\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                  ,0xc3c,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  if (local_4a68 < uVar38) {
    __assert_fail("(num_groups <= max_groups) && (\"sanity check failed. we wrote more groups than we allocated\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/demo/../src/ogt_vox.h"
                  ,0xc3f,
                  "ogt_vox_scene *ogt_vox_merge_scenes(const ogt_vox_scene **, uint32_t, const ogt_vox_rgba *, const uint32_t)"
                 );
  }
  memset(local_4a30,0,0x4440);
  poVar26->instances = poVar34;
  poVar26->num_instances = local_49ec;
  poVar26->models = ppoVar35;
  poVar26->num_models = local_49f0;
  poVar26->layers = local_4998;
  poVar26->num_layers = 1;
  poVar26->groups = local_49f8;
  poVar26->num_groups = uVar38;
  memcpy(&poVar26->palette,&local_4838,0x400);
  memcpy(&poVar26->materials,local_4038,0x4000);
  if (local_49d8.data != (uint *)0x0) {
    (*g_free_func)(local_49d8.data);
  }
  if (local_49b8.data != (uint *)0x0) {
    (*g_free_func)(local_49b8.data);
  }
  return poVar26;
}

Assistant:

ogt_vox_scene* ogt_vox_merge_scenes(const ogt_vox_scene** scenes, uint32_t scene_count, const ogt_vox_rgba* required_colors, const uint32_t required_color_count) {
        ogt_assert(required_color_count <= 255, "too many colors specified"); // can't exceed the maximum colors in the master palette plus the empty slot.

        // initialize the master palette. If required colors are specified, map them into the master palette now.
        ogt_vox_rgba  master_palette[256];
        ogt_vox_matl materials[256];
        uint32_t master_palette_count = 1;          // color_index 0 is reserved for empty color!
        memset(&master_palette, 0, sizeof(master_palette));
        memset(&materials, 0, sizeof(materials));
        for (uint32_t required_index = 0; required_index < required_color_count; required_index++)
            master_palette[master_palette_count++] = required_colors[required_index];

        // count the number of required models, instances in the master scene
        uint32_t max_layers = 1;  // we don't actually merge layers. Every instance will be in layer 0.
        uint32_t max_models = 0;
        uint32_t max_instances = 0;
        uint32_t max_groups = 1;  // we add 1 root global group that everything will ultimately be parented to.
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            if (!scenes[scene_index])
                continue;
            max_instances += scenes[scene_index]->num_instances;
            max_models += scenes[scene_index]->num_models;
            max_groups += scenes[scene_index]->num_groups;
        }

        // allocate the master instances array
        ogt_vox_instance* instances     = (ogt_vox_instance*)_vox_malloc(sizeof(ogt_vox_instance) * max_instances);
        ogt_vox_model**   models        = (ogt_vox_model**)_vox_malloc(sizeof(ogt_vox_model*) * max_models);
        ogt_vox_layer*    layers        = (ogt_vox_layer*)_vox_malloc(sizeof(ogt_vox_layer) * max_layers);
        ogt_vox_group*    groups        = (ogt_vox_group*)_vox_malloc(sizeof(ogt_vox_group) * max_groups);
        uint32_t          num_instances = 0;
        uint32_t          num_models    = 0;
        uint32_t          num_layers    = 0;

        // add a single layer.
        layers[num_layers].hidden = false;
        layers[num_layers].color  = {255, 255, 255, 255};
        layers[num_layers].name = "merged";
        num_layers++;

        // magicavoxel expects exactly 1 root group, so if we have multiple scenes with multiple roots,
        // we must ensure all merged scenes are parented to the same root group. Allocate it now for the
        // merged scene.
        uint32_t global_root_group_index = 0;
        {
            ogt_vox_group root_group;
            root_group.name                    = NULL;
            root_group.hidden                  = false;
            root_group.layer_index             = 0;
            root_group.parent_group_index      = k_invalid_group_index;
            root_group.transform               = ogt_vox_transform_get_identity();
            clear_anim_transform(&root_group.transform_anim);
            groups[0] = root_group;
        }
        uint32_t num_groups = 1; // we just wrote the global root group index, so all per-scene groups are allocated after.

        // go ahead and do the merge now!
        _vox_array<uint32_t> per_scene_base_model_index;
        _vox_array<uint32_t> per_scene_base_instance_index;
        size_t misc_data_size = 0;
        int32_t offset_x = 0;
        for (uint32_t scene_index = 0; scene_index < scene_count; scene_index++) {
            const ogt_vox_scene* scene = scenes[scene_index];
            if (!scene)
                continue;

            // update the master palette, and get the map of this scene's color indices into the master palette.
            uint32_t scene_color_index_to_master_map[256];
            update_master_palette_and_materials_from_scene(master_palette, master_palette_count, scene, scene_color_index_to_master_map, materials);

            // cache away the base model index for this scene.
            uint32_t base_model_index = num_models;
            uint32_t base_group_index = num_groups;

            per_scene_base_model_index.push_back(base_model_index);
            per_scene_base_instance_index.push_back(num_instances);

            // create copies of all models that have color indices remapped.
            for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
                const ogt_vox_model* model = scene->models[model_index];
                uint32_t voxel_count = model->size_x * model->size_y * model->size_z;
                // clone the model
                ogt_vox_model* override_model = (ogt_vox_model*)_vox_malloc(sizeof(ogt_vox_model) + voxel_count);
                uint8_t * override_voxel_data = (uint8_t*)& override_model[1];

                // remap all color indices in the cloned model so they reference the master palette now!
                for (uint32_t voxel_index = 0; voxel_index < voxel_count; voxel_index++) {
                    uint8_t  old_color_index = model->voxel_data[voxel_index];
                    uint32_t new_color_index = scene_color_index_to_master_map[old_color_index];
                    ogt_assert(new_color_index < 256, "color index out of bounds");
                    override_voxel_data[voxel_index] = (uint8_t)new_color_index;
                }
                // assign the new model.
                *override_model = *model;
                override_model->voxel_data = override_voxel_data;
                override_model->voxel_hash = _vox_hash(override_voxel_data, voxel_count);

                models[num_models++] = override_model;
            }

            // compute the scene bounding box on x dimension. this is used to offset instances
            // and groups in the merged model along X dimension such that they do not overlap
            // with instances from another scene in the merged model.
            int32_t scene_min_x, scene_max_x;
            compute_scene_bounding_box_x(scene, scene_min_x, scene_max_x);
            float scene_offset_x = (float)(offset_x - scene_min_x);

            // each scene has a root group, and it must the 0th group in its local groups[] array,
            ogt_assert(scene->groups[0].parent_group_index == k_invalid_group_index, "first group of scene must not be parented to any other group");
            // create copies of all groups into the merged scene (except the root group from each scene -- which is why we start group_index at 1 here)
            for (uint32_t group_index = 1; group_index < scene->num_groups; group_index++) {
                const ogt_vox_group* src_group = &scene->groups[group_index];
                ogt_assert(src_group->parent_group_index != k_invalid_group_index, "all groups after the first in the scene must be parented to a valid group"); // there can be only 1 root group per scene and it must be the 0th group.
                ogt_vox_group dst_group = *src_group;
                ogt_assert(dst_group.parent_group_index < scene->num_groups, "group index is out of bounds");
                dst_group.layer_index        = 0;
                dst_group.parent_group_index = (dst_group.parent_group_index == 0) ? global_root_group_index : base_group_index + (dst_group.parent_group_index - 1);
                if (dst_group.name)
                    misc_data_size += _vox_strlen(dst_group.name) + 1; // + 1 for zero terminator
                if (dst_group.transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_group.transform_anim.num_keyframes);
                // if this group belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_group.parent_group_index == global_root_group_index)
                    dst_group.transform.m30 += scene_offset_x;
                groups[num_groups++] = dst_group;
            }

            // create copies of all instances (and bias them such that minimum on x starts at zero)
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* src_instance = &scene->instances[instance_index];
                ogt_assert(src_instance->group_index < scene->num_groups, "group index is out of bounds");  // every instance must be mapped to a group.
                ogt_vox_instance* dst_instance = &instances[num_instances++];
                *dst_instance = *src_instance;
                dst_instance->layer_index = 0;
                dst_instance->group_index = (dst_instance->group_index == 0) ? global_root_group_index : base_group_index + (dst_instance->group_index - 1);
                dst_instance->model_index += base_model_index;
                if (dst_instance->name)
                    misc_data_size += _vox_strlen(dst_instance->name) + 1; // + 1 for zero terminator
                if (dst_instance->transform_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_transform) * dst_instance->transform_anim.num_keyframes);
                if (dst_instance->model_anim.num_keyframes)
                    misc_data_size += (sizeof(ogt_vox_keyframe_model) * dst_instance->model_anim.num_keyframes);

                // if this instance belongs to the global root group, it must be translated so it doesn't overlap with other scenes.
                if (dst_instance->group_index == global_root_group_index)
                    dst_instance->transform.m30 += scene_offset_x;
            }

            offset_x += (scene_max_x - scene_min_x); // step the width of the scene in x dimension
            offset_x += 4;                           // a margin of this many voxels between scenes
        }

        // fill any unused master palette entries with purple/invalid color.
        const ogt_vox_rgba k_invalid_color = { 255, 0, 255, 255 };  // purple = invalid
        for (uint32_t color_index = master_palette_count; color_index < 256; color_index++)
            master_palette[color_index] = k_invalid_color;

        // assign the master scene on output. misc_data is part of the scene allocation.
        size_t scene_size = sizeof(ogt_vox_scene) + misc_data_size;
        ogt_vox_scene * merged_scene = (ogt_vox_scene*)_vox_calloc(scene_size);

        // copy name and keyframe data into the misc_data section and make instances/groups point to it.
        // This makes the merged model self-contained.
        {
            char* scene_misc_data = (char*)&merged_scene[1];
            for (uint32_t instance_index = 0; instance_index < num_instances; instance_index++) {
                if (instances[instance_index].name) {
                    size_t string_len = _vox_strlen(instances[instance_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, instances[instance_index].name, string_len);
                    instances[instance_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (instances[instance_index].model_anim.num_keyframes) {
                    ogt_vox_keyframe_model* model_keyframes = (ogt_vox_keyframe_model*)scene_misc_data;
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_model) * instances[instance_index].model_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].model_anim.keyframes, keyframe_size);
                    instances[instance_index].model_anim.keyframes = model_keyframes;
                    scene_misc_data += keyframe_size;
                    // bias the model_index in model_keyframes back into the range for the scene that this instance came from.
                    for (int32_t scene_index = (int32_t)(per_scene_base_instance_index.size() - 1); scene_index >= 0; scene_index--) {
                        if (instance_index >= per_scene_base_instance_index[scene_index]) {
                            for (uint32_t j = 0; j < instances[instance_index].model_anim.num_keyframes; j++)
                                model_keyframes[j].model_index += per_scene_base_model_index[scene_index];
                            break;
                        }
                    }
                }
                if (instances[instance_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * instances[instance_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, instances[instance_index].transform_anim.keyframes, keyframe_size);
                    instances[instance_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }
            for (uint32_t group_index = 0; group_index < num_groups; group_index++) {
                if (groups[group_index].name) {
                    size_t string_len = _vox_strlen(groups[group_index].name) + 1; // +1 for zero terminator
                    memcpy(scene_misc_data, groups[group_index].name, string_len);
                    groups[group_index].name = scene_misc_data;
                    scene_misc_data += string_len;
                }
                if (groups[group_index].transform_anim.num_keyframes) {
                    uint32_t keyframe_size = sizeof(ogt_vox_keyframe_transform) * groups[group_index].transform_anim.num_keyframes;
                    memcpy(scene_misc_data, groups[group_index].transform_anim.keyframes, keyframe_size);
                    groups[group_index].transform_anim.keyframes = (ogt_vox_keyframe_transform*)scene_misc_data;
                    scene_misc_data += keyframe_size;
                }
            }

            ogt_assert(scene_misc_data <= ((char*)&merged_scene[1] + misc_data_size), "misc_data allocation was overrun");
        }

        ogt_assert(num_groups <= max_groups, "sanity check failed. we wrote more groups than we allocated");

        memset(merged_scene, 0, sizeof(ogt_vox_scene));
        merged_scene->instances     = instances;
        merged_scene->num_instances = max_instances;
        merged_scene->models        = (const ogt_vox_model * *)models;
        merged_scene->num_models    = max_models;
        merged_scene->layers        = layers;
        merged_scene->num_layers    = max_layers;
        merged_scene->groups        = groups;
        merged_scene->num_groups    = num_groups;
        // copy color palette into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene->palette.color[color_index] = master_palette[color_index];
        // copy materials into the merged scene
        for (uint32_t color_index = 0; color_index < 256; color_index++)
            merged_scene-> materials.matl[color_index] = materials[color_index];

        return merged_scene;
    }